

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

void poll_dealloc(event_base *base)

{
  void *__s;
  pollop *pop;
  event_base *base_local;
  
  __s = base->evbase;
  evsig_dealloc_(base);
  if (*(long *)((long)__s + 0x10) != 0) {
    event_mm_free_(*(void **)((long)__s + 0x10));
  }
  if (*(long *)((long)__s + 0x18) != 0) {
    event_mm_free_(*(void **)((long)__s + 0x18));
  }
  memset(__s,0,0x20);
  event_mm_free_(__s);
  return;
}

Assistant:

static void
poll_dealloc(struct event_base *base)
{
	struct pollop *pop = base->evbase;

	evsig_dealloc_(base);
	if (pop->event_set)
		mm_free(pop->event_set);
	if (pop->event_set_copy)
		mm_free(pop->event_set_copy);

	memset(pop, 0, sizeof(struct pollop));
	mm_free(pop);
}